

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void init_module_trodesnetwork(void)

{
  self *this;
  self *name;
  self *f;
  char *doc;
  undefined4 in_stack_fffffffffffff120;
  CurrentScaling in_stack_fffffffffffff124;
  object_operators<boost::python::api::object> *in_stack_fffffffffffff128;
  return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
  *in_stack_fffffffffffff130;
  char *in_stack_fffffffffffff138;
  init_base<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  *in_stack_fffffffffffff140;
  char (*in_stack_fffffffffffff148) [16];
  init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  *in_stack_fffffffffffff150;
  char *in_stack_fffffffffffff158;
  class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  *in_stack_fffffffffffff160;
  char *in_stack_fffffffffffff168;
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_stack_fffffffffffff170;
  first_type in_stack_fffffffffffff178;
  char *in_stack_fffffffffffff188;
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_stack_fffffffffffff190;
  first_type in_stack_fffffffffffff1a8;
  char *in_stack_fffffffffffff1b8;
  class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_stack_fffffffffffff1c0;
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_6b8;
  code *local_698;
  undefined8 local_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  undefined8 local_670;
  code *local_668;
  undefined8 local_660;
  code *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_638;
  code *local_618;
  undefined8 local_610;
  code *local_608;
  undefined8 local_600;
  code *local_5f8;
  undefined8 local_5f0;
  code *local_5e8;
  undefined8 local_5e0;
  code *local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_5b8;
  code *local_598;
  undefined8 local_590;
  code *local_588;
  undefined8 local_580;
  code *local_578;
  undefined8 local_570;
  code *local_568;
  undefined8 local_560;
  code *local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_538;
  code *local_518;
  undefined8 local_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  undefined8 local_4f0;
  code *local_4e8;
  undefined8 local_4e0;
  code *local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_4b8;
  code *local_498;
  undefined8 local_490;
  code *local_488;
  undefined8 local_480;
  code *local_478;
  undefined8 local_470;
  code *local_468;
  undefined8 local_460;
  code *local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_438;
  undefined8 local_418;
  undefined8 local_410;
  code *local_400;
  undefined8 local_3f8;
  code *local_3f0;
  undefined8 local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  code *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_3b0;
  code *local_390;
  undefined8 local_388;
  code *local_380;
  undefined8 local_378;
  code *local_370;
  undefined8 local_368;
  code *local_360;
  undefined8 local_358;
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_350;
  code *local_330;
  undefined8 local_328;
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_320;
  code *local_2f8;
  undefined8 local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  code *local_298;
  undefined8 local_290;
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_288;
  code *local_268;
  undefined8 local_260;
  code *local_258;
  undefined8 local_250;
  code *local_248;
  undefined8 local_240;
  code *local_238;
  undefined8 local_230;
  code *local_228;
  undefined8 local_220;
  code *local_218;
  undefined8 local_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  undefined8 local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  
  PyEval_InitThreads();
  Py_Initialize();
  boost::python::numpy::initialize(true);
  boost::python::
  to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::to_python_converter
            ((to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::
  to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
  ::to_python_converter
            ((to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
              *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>
  ::to_python_converter
            ((to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false> *)
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::
  to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
  ::to_python_converter
            ((to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
              *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::
  to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
  ::to_python_converter
            ((to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
              *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::to_python_converter<TrodesMsg,_TrodesMsgToList,_false>::to_python_converter
            ((to_python_converter<TrodesMsg,_TrodesMsgToList,_false> *)
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::to_python_converter<lfpPacket,_lfpPacketToList,_false>::to_python_converter
            ((to_python_converter<lfpPacket,_lfpPacketToList,_false> *)
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [7])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38bd4c);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38bdaf);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (int *)in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38be12);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [12])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38be75);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [13])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38bed8);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [14])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38bf3b);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [12])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38bf9e);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [10])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38c001);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [5])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38c064);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [5])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38c0c7);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [6])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38c12a);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::scope::scope((scope *)in_stack_fffffffffffff140);
  boost::python::api::object_operators<boost::python::api::object>::attr
            (in_stack_fffffffffffff128,
             (char *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::api::proxy<boost::python::api::attribute_policies>::operator=
            ((proxy<boost::python::api::attribute_policies> *)in_stack_fffffffffffff150,
             (char (*) [5])in_stack_fffffffffffff148);
  boost::python::api::proxy<boost::python::api::attribute_policies>::~proxy
            ((proxy<boost::python::api::attribute_policies> *)0x38c18d);
  boost::python::scope::~scope
            ((scope *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)in_stack_fffffffffffff170,in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160)
  ;
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::add_property<unsigned_int_timestamp_t::*>
            ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,
             (offset_in_timestamp_t_to_unsigned_int)in_stack_fffffffffffff150,
             *in_stack_fffffffffffff148);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::add_property<long_timestamp_t::*>
            ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,
             (offset_in_timestamp_t_to_long)in_stack_fffffffffffff150,*in_stack_fffffffffffff148);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38c217);
  boost::python::def<long(*)()>
            ((char *)in_stack_fffffffffffff150,(_func_long *)in_stack_fffffffffffff148);
  boost::python::
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)in_stack_fffffffffffff170,in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160)
  ;
  local_1b8 = HighFreqDataType::getName_abi_cxx11_;
  local_1b0 = 0;
  local_1c8 = HighFreqDataType::setName;
  local_1c0 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff178,
             (first_type)in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff1c0);
  local_1d8 = HighFreqDataType::getOrigin_abi_cxx11_;
  local_1d0 = 0;
  local_1e8 = HighFreqDataType::setOrigin;
  local_1e0 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff178,
             (first_type)in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff1c0);
  local_1f8 = HighFreqDataType::getDataFormat_abi_cxx11_;
  local_1f0 = 0;
  local_208 = HighFreqDataType::setDataFormat;
  local_200 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff178,
             (first_type)in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff1c0);
  local_218 = HighFreqDataType::getSockAddr_abi_cxx11_;
  local_210 = 0;
  local_228 = HighFreqDataType::setSockAddr;
  local_220 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff178,
             (first_type)in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff1c0);
  local_238 = HighFreqDataType::getByteSize;
  local_230 = 0;
  local_248 = HighFreqDataType::setByteSize;
  local_240 = 0;
  doc = (char *)0x0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::add_property<int(HighFreqDataType::*)()const,void(HighFreqDataType::*)(int)>
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff178,
             (first_type)in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff1c0);
  local_258 = HighFreqDataType::isValid;
  local_250 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(HighFreqDataType::*)()const>
            ((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_268 = HighFreqDataType::print;
  local_260 = 0;
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(HighFreqDataType::*)()>
            ((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38c557);
  boost::python::
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_288,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)in_stack_fffffffffffff140);
  local_298 = StimulationCommand::setGroup;
  local_290 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)(int)>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2a8 = StimulationCommand::setNoGroup;
  local_2a0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(StimulationCommand::*)()>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2b8 = StimulationCommand::setSlot;
  local_2b0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)(int)>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2c8 = StimulationCommand::setChannels;
  local_2c0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)(int,int,int,int)>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2d8 = StimulationCommand::setBiphasicPulseShape;
  local_2d0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short)>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2e8 = StimulationCommand::setNumPulsesInTrain;
  local_2e0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(StimulationCommand::*)(unsigned_short)>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_2f8 = StimulationCommand::isValid;
  local_2f0 = 0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)()>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38c798);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::enum_
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff140,
             in_stack_fffffffffffff138,(char *)in_stack_fffffffffffff130);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::value
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)in_stack_fffffffffffff130,
             (char *)in_stack_fffffffffffff128,in_stack_fffffffffffff124);
  boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::~enum_
            ((enum_<GlobalStimulationSettings::CurrentScaling> *)0x38c924);
  boost::python::
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_320,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationSettings,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)in_stack_fffffffffffff140);
  local_330 = GlobalStimulationSettings::setVoltageScale;
  local_328 = 0;
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationSettings::*)(GlobalStimulationSettings::CurrentScaling)>
            ((class_<GlobalStimulationSettings,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<GlobalStimulationSettings,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<GlobalStimulationSettings,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38c9af);
  boost::python::
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_350,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)in_stack_fffffffffffff140);
  local_360 = GlobalStimulationCommand::setStimEnabled;
  local_358 = 0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)(bool)>
            ((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_370 = GlobalStimulationCommand::setResetSequencer;
  local_368 = 0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            ((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_380 = GlobalStimulationCommand::setAbortStimulation;
  local_378 = 0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            ((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_390 = GlobalStimulationCommand::setClearDSPOffset;
  local_388 = 0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            ((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<GlobalStimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38cb15);
  boost::python::
  init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_3b0,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (init_base<boost::python::init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)in_stack_fffffffffffff140);
  local_3b8 = 0;
  local_3c0 = 0x11;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(HFSubConsumer::*)()>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_3d0 = HFSubConsumer_python::readData_python;
  local_3c8 = 0;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(boost::python::numpy::ndarray)>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_3e0 = HFSubConsumer::available;
  local_3d8 = 0;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_3f0 = HighFreqSub::getType;
  local_3e8 = 0;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<HighFreqDataType(HighFreqSub::*)()>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_400 = HFSubConsumer::lastSysTimestamp;
  local_3f8 = 0;
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<HFSubConsumer_python,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38ccc1);
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_(in_stack_fffffffffffff170,in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  local_410 = 0;
  boost::python::
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def_readwrite<std::vector<int,std::allocator<int>>HFParsingInfo::*>
            ((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff130,(char *)in_stack_fffffffffffff128,
             (offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),doc);
  local_418 = 0x18;
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::def_readwrite<unsigned_long_HFParsingInfo::*>
            ((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff130,(char *)in_stack_fffffffffffff128,
             (offset_in_HFParsingInfo_to_unsigned_long *)
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),doc);
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38cd5e);
  boost::python::
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_438,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  local_440 = 0;
  local_448 = 0x11;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(LFPConsumer::*)()>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_458 = LFPConsumer_python::getData_python;
  local_450 = 0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<timestamp_t(LFPConsumer_python::*)()>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_468 = HFSubConsumer::available;
  local_460 = 0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_478 = LFPConsumer_python::create_numpy_array;
  local_470 = 0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::numpy::ndarray(LFPConsumer_python::*)()>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_488 = HFSubConsumer::lastSysTimestamp;
  local_480 = 0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_498 = LFPConsumer::getNTrodesRequested_abi_cxx11_;
  local_490 = 0;
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const>
            ((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_((class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
             *)0x38cf53);
  boost::python::
  init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_4b8,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)in_stack_fffffffffffff150);
  local_4c0 = 0;
  local_4c8 = 0x11;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(SpikesConsumer::*)()>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_4d8 = SpikesConsumer_python::getData_python;
  local_4d0 = 0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<timestamp_t(SpikesConsumer_python::*)()>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_4e8 = HFSubConsumer::available;
  local_4e0 = 0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_4f8 = SpikesConsumer_python::create_numpy_array;
  local_4f0 = 0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::numpy::ndarray(SpikesConsumer_python::*)()>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_508 = HFSubConsumer::lastSysTimestamp;
  local_500 = 0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_518 = SpikesConsumer::getNTrodesRequested_abi_cxx11_;
  local_510 = 0;
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(SpikesConsumer::*)()const>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
             *)0x38d148);
  boost::python::
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_538,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  local_540 = 0;
  local_548 = 0x11;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(AnalogConsumer::*)()>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_558 = AnalogConsumer_python::getData_python;
  local_550 = 0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<timestamp_t(AnalogConsumer_python::*)()>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_568 = HFSubConsumer::available;
  local_560 = 0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_578 = AnalogConsumer_python::create_numpy_array;
  local_570 = 0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::numpy::ndarray(AnalogConsumer_python::*)()>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_588 = HFSubConsumer::lastSysTimestamp;
  local_580 = 0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_598 = AnalogConsumer::getChannelsRequested_abi_cxx11_;
  local_590 = 0;
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AnalogConsumer::*)()const>
            ((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_((class_<AnalogConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
             *)0x38d33d);
  boost::python::
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_5b8,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  local_5c0 = 0;
  local_5c8 = 0x11;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(DigitalConsumer::*)()>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_5d8 = DigitalConsumer_python::getData_python;
  local_5d0 = 0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<timestamp_t(DigitalConsumer_python::*)()>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_5e8 = HFSubConsumer::available;
  local_5e0 = 0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_5f8 = DigitalConsumer_python::create_numpy_array;
  local_5f0 = 0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::numpy::ndarray(DigitalConsumer_python::*)()>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_608 = HFSubConsumer::lastSysTimestamp;
  local_600 = 0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_618 = DigitalConsumer::getChannelsRequested_abi_cxx11_;
  local_610 = 0;
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(DigitalConsumer::*)()const>
            ((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_((class_<DigitalConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
             *)0x38d532);
  boost::python::
  init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_638,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            (in_stack_fffffffffffff160,in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  local_640 = 0;
  local_648 = 0x11;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(NeuralConsumer::*)()>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_658 = NeuralConsumer_python::getData_python;
  local_650 = 0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<timestamp_t(NeuralConsumer_python::*)()>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_668 = HFSubConsumer::available;
  local_660 = 0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<unsigned_long(HFSubConsumer::*)(long)>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_678 = NeuralConsumer_python::create_numpy_array;
  local_670 = 0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::numpy::ndarray(NeuralConsumer_python::*)()>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_688 = HFSubConsumer::lastSysTimestamp;
  local_680 = 0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  local_698 = NeuralConsumer::getChannelsRequested_abi_cxx11_;
  local_690 = 0;
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(NeuralConsumer::*)()const>
            ((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_((class_<NeuralConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
             *)0x38d727);
  boost::python::
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_6b8,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,in_stack_fffffffffffff140);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(PythonModuleClient::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<void(AbstractModuleClient::*)(std::__cxx11::string),void(PythonModuleClient::*)(std::__cxx11::string)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(),void(PythonModuleClient::*)()>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<void(AbstractModuleClient::*)(std::__cxx11::string),void(PythonModuleClient::*)(std::__cxx11::string)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(),void(PythonModuleClient::*)()>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(unsigned_int),void(PythonModuleClient::*)(unsigned_int)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(int),void(PythonModuleClient::*)(int)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),void(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&)>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,(first_type *)in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(MlmWrap::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::str,boost::python::list&)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<std::__cxx11::string(MlmWrap::*)()const>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(MlmWrap::*)(HighFreqDataType)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(MlmWrap::*)(HighFreqDataType)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>(MlmWrap::*)()>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,unsigned_long),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(MlmWrap::*)(char_const*)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<int(MlmWrap::*)(char_const*)>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  this = boost::python::
         class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
         ::def<std::vector<EventDataType,std::allocator<EventDataType>>(MlmWrap::*)()>
                   (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1a8);
  name = boost::python::
         class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
         ::
         def<LFPConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                   ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                     *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
                    (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<SpikesConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  f = boost::python::
      class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
      ::
      def<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
                ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                  *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
                 (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<DigitalConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<NeuralConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            ((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_stack_fffffffffffff150,*in_stack_fffffffffffff148,
             (first_type)in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string)>
            (this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)()>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)()>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)()>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(StimulationCommand)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(GlobalStimulationSettings)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(GlobalStimulationCommand)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(AbstractModuleClient::*)(unsigned_short)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<unsigned_int(AbstractModuleClient::*)()>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string)>(this,(char *)name,(first_type)f);
  boost::python::
  class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_((class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
             *)0x38e5fd);
  return;
}

Assistant:

BOOST_PYTHON_MODULE(trodesnetwork){
    PyEval_InitThreads();
    Py_Initialize();
    np::initialize();
    to_python_converter<std::vector<std::string>, vecToList<std::string> >();
    to_python_converter<std::vector<byte>, vecToList<byte> >();
    to_python_converter<std::vector<int>, vecToList<int> >();
    to_python_converter<std::vector<EventDataType>, EventVecToDict>();
    to_python_converter<std::vector<HighFreqDataType>, vecToList<HighFreqDataType> >();
    to_python_converter<TrodesMsg, TrodesMsgToList>();
    to_python_converter<lfpPacket, lfpPacketToList>();

    scope().attr("TRODES_NETWORK_ID") = TRODES_NETWORK_ID;
    scope().attr("DEFAULT_SERVER_ADDRESS") = DEFAULT_SERVER_ADDRESS;
    scope().attr("DEFAULT_SERVER_PORT") = DEFAULT_SERVER_PORT;
    scope().attr("NEURALSTREAM") = hfType_NEURO;
    scope().attr("ANALOGSTREAM") = hfType_ANALOG;
    scope().attr("DIGITALSTREAM") = hfType_DIGITAL;
    scope().attr("SPIKESTREAM") = hfType_SPIKE;
    scope().attr("LFPSTREAM") = hfType_LFP;
    scope().attr("acq_PLAY") = acq_PLAY;
    scope().attr("acq_STOP") = acq_STOP;
    scope().attr("acq_PAUSE") = acq_PAUSE;
    scope().attr("acq_SEEK") = acq_SEEK;

//    scope().attr("settle_CMD") = settle_CMD;

    class_<timestamp_t>("timestamp_t")
            .add_property("trodes_timestamp", &timestamp_t::trodes_timestamp)
            .add_property("system_timestamp", &timestamp_t::system_timestamp)
            ;
    def("systemTimeMSecs", &CZHelp::systemTimeMSecs);

    class_<HighFreqDataType>
            ("HighFreqDataType")
            .add_property("name", &HighFreqDataType::getName, &HighFreqDataType::setName)
            .add_property("origin", &HighFreqDataType::getOrigin, &HighFreqDataType::setOrigin)
            .add_property("dataFormat", &HighFreqDataType::getDataFormat, &HighFreqDataType::setDataFormat)
            .add_property("address", &HighFreqDataType::getSockAddr, &HighFreqDataType::setSockAddr)
            .add_property("byteSize", &HighFreqDataType::getByteSize, &HighFreqDataType::setByteSize)
            .def("isValid", &HighFreqDataType::isValid)
            .def("print", &HighFreqDataType::print)
            ;

    class_<StimulationCommand>
            ("StimulationCommand", init<>())
//            .def(init<int, int, int, uint16_t, uint8_t, uint16_t, uint8_t, uint16_t, uint16_t, uint16_t>())
            .def("setGroup", &StimulationCommand::setGroup)
            .def("setNoGroup", &StimulationCommand::setNoGroup)
            .def("setSlot", &StimulationCommand::setSlot)
            .def("setChannels",&StimulationCommand::setChannels)
            .def("setBiphasicPulseShape", &StimulationCommand::setBiphasicPulseShape)
            .def("setNumPulsesInTrain", &StimulationCommand::setNumPulsesInTrain)
            .def("isValid", &StimulationCommand::isValid)
            ;

    enum_<GlobalStimulationSettings::CurrentScaling>("CurrentScaling")
            .value("max10nA", GlobalStimulationSettings::max10nA)
            .value("max20nA", GlobalStimulationSettings::max20nA)
            .value("max50nA", GlobalStimulationSettings::max50nA)
            .value("max100nA", GlobalStimulationSettings::max100nA)
            .value("max200nA", GlobalStimulationSettings::max200nA)
            .value("max500nA", GlobalStimulationSettings::max500nA)
            .value("max1uA", GlobalStimulationSettings::max1uA)
            .value("max2uA", GlobalStimulationSettings::max2uA)
            .value("max5uA", GlobalStimulationSettings::max5uA)
            .value("max10uA", GlobalStimulationSettings::max10uA)
            ;

    class_<GlobalStimulationSettings>("GlobalStimulationSettings", init<>())
            .def("setVoltageScale", &GlobalStimulationSettings::setVoltageScale)
            ;

    class_<GlobalStimulationCommand>("GlobalStimulationCommand", init<>())
            .def("setStimEnabled", &GlobalStimulationCommand::setStimEnabled)
            .def("setResetSequencer", &GlobalStimulationCommand::setResetSequencer)
            .def("setAbortStimulation", &GlobalStimulationCommand::setAbortStimulation)
            .def("setClearDSPOffset", &GlobalStimulationCommand::setClearDSPOffset)
            ;
//    void (HighFreqPub::*pubdatax2)(void, size_t) = &HighFreqPub::publishData;
//    void (HighFreqPub::*pubdatax3)(void, size_t, int64_t) = &HighFreqPub::publishData;
//    class_<HighFreqPub, boost::noncopyable>
//            ("HighFreqPub")
//            .def("initialize", &HighFreqPub::initialize)
//            .def("publishData", pubdatax2)
//            .def("publishData", pubdatax3)
//            .def("getAddress", &HighFreqPub::getAddress)
//            ;

    class_<HFSubConsumer_python, boost::noncopyable>
            ("HFSubConsumer", init<HighFreqDataType, int>())
            .def("initialize", &HFSubConsumer_python::initialize)
            .def("readData", static_cast<size_t (HFSubConsumer::*)(np::ndarray)>(&HFSubConsumer_python::readData_python))
            .def("available", &HFSubConsumer_python::available)
            .def("getDataType", &HFSubConsumer_python::getType)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            ;

    class_<HFParsingInfo>("HFParsingInfo")
            .def_readwrite("indices", &HFParsingInfo::indices)
            .def_readwrite("sizeOf", &HFParsingInfo::sizeOf)
            ;

    class_<LFPConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("LFPConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &LFPConsumer_python::initialize)
            .def("getData", &LFPConsumer_python::getData_python)
            .def("available", &LFPConsumer_python::available)
            .def("create_numpy_array", &LFPConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &LFPConsumer_python::getNTrodesRequested)
            ;

    class_<SpikesConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("SpikesConsumer", init<HighFreqDataType, int, HFParsingInfo, int>())
            .def("initialize", &SpikesConsumer_python::initialize)
            .def("getData",&SpikesConsumer_python::getData_python)
            .def("available", &SpikesConsumer_python::available)
            .def("create_numpy_array", &SpikesConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &SpikesConsumer_python::getNTrodesRequested)
            ;

    class_<AnalogConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &AnalogConsumer_python::initialize)
            .def("getData",&AnalogConsumer_python::getData_python)
            .def("available", &AnalogConsumer_python::available)
            .def("create_numpy_array", &AnalogConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &AnalogConsumer::getChannelsRequested)
            ;

    class_<DigitalConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &DigitalConsumer_python::initialize)
            .def("getData",&DigitalConsumer_python::getData_python)
            .def("available", &DigitalConsumer_python::available)
            .def("create_numpy_array", &DigitalConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &DigitalConsumer::getChannelsRequested)
            ;

    class_<NeuralConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("NeuralConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &NeuralConsumer_python::initialize)
            .def("getData",&NeuralConsumer_python::getData_python)
            .def("available", &NeuralConsumer_python::available)
            .def("create_numpy_array", &NeuralConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &NeuralConsumer::getChannelsRequested)
            ;

    class_<PythonModuleClient, boost::noncopyable>
        ("AbstractModuleClient", init<std::string, std::string, int>())
        .def("closeConnections", &PythonModuleClient::close_python)
        .def("recv_acquisition", &AbstractModuleClient::recv_acquisition,&PythonModuleClient::default_recv_acquisition)
        .def("recv_file_open", &AbstractModuleClient::recv_file_open,&PythonModuleClient::default_recv_file_open)
        .def("recv_file_close", &AbstractModuleClient::recv_file_close,&PythonModuleClient::default_recv_file_close)
        .def("recv_source", &AbstractModuleClient::recv_source,&PythonModuleClient::default_recv_source)
        .def("recv_quit", &AbstractModuleClient::recv_quit,&PythonModuleClient::default_recv_quit)
        .def("recv_time", &AbstractModuleClient::recv_time,&PythonModuleClient::default_recv_time)
        .def("recv_timerate", &AbstractModuleClient::recv_timerate,&PythonModuleClient::default_recv_timerate)
        .def("recv_event", &AbstractModuleClient::recv_event,&PythonModuleClient::default_recv_event)
        .def("initialize", &PythonModuleClient::initialize)
        .def("subscribeToEvent", &PythonModuleClient::subscribeToEvent)
        .def("unsubscribeFromEvent", &PythonModuleClient::unsubscribeFromEvent)
        .def("sendMsgToTrodes", &PythonModuleClient::sendMsgToTrodes_python)
        .def("sendMsgToModule", &PythonModuleClient::sendMsgToModule_python)
        .def("sendOutEvent", &PythonModuleClient::sendOutEvent_python)
        .def("sendTimeRequest", &PythonModuleClient::sendTimeRequest)
        .def("sendTimeRateRequest", &PythonModuleClient::sendTimeRateRequest)
        .def("getID", &PythonModuleClient::getID)
        .def("getClients", &PythonModuleClient::getClients)
        .def("registerHighFreqData", &PythonModuleClient::registerHighFreqData)
        .def("deregisterHighFreqData", &PythonModuleClient::deregisterHighFreqData)
        .def("getHighFreqList", &PythonModuleClient::getHighFreqList)
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_python, return_value_policy<manage_new_object>())
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_default_python, return_value_policy<manage_new_object>())
        .def("unsubscribeHighFreqData", &PythonModuleClient::unsubscribeHighFreqData)
        .def("provideEvent", &PythonModuleClient::provideEvent)
        .def("unprovideEvent",&PythonModuleClient::unprovideEvent)
        .def("getEventList", &PythonModuleClient::getEventList)
        .def("subscribeLFPData", &PythonModuleClient::sublfpdata_python, return_value_policy<manage_new_object>())
        .def("subscribeSpikesData", &PythonModuleClient::subspikesdata_python, return_value_policy<manage_new_object>())
        .def("subscribeAnalogData", &PythonModuleClient::subanalogdata_python, return_value_policy<manage_new_object>())
        .def("subscribeDigitalData", &PythonModuleClient::subdigitaldata_python, return_value_policy<manage_new_object>())
        .def("subscribeNeuralData", &PythonModuleClient::subneuraldata_python, return_value_policy<manage_new_object>())
        .def("getAvailableTrodesData", &PythonModuleClient::getAvailableTrodesData)
        .def("initializeHardwareConnection", &PythonModuleClient::initializeHardwareConnection)
        .def("destroyHardwareConnection", &PythonModuleClient::destroyHardwareConnection)
        .def("sendSettleCommand", &PythonModuleClient::sendSettleCommand)
        .def("sendStimulationParams", &PythonModuleClient::sendStimulationParams)
        .def("sendClearStimulationParams", &PythonModuleClient::sendClearStimulationParams)
        .def("sendStimulationStartSlot", &PythonModuleClient::sendStimulationStartSlot)
        .def("sendStimulationStartGroup",&PythonModuleClient::sendStimulationStartGroup)
        .def("sendStimulationStopSlot", &PythonModuleClient::sendStimulationStopSlot)
        .def("sendStimulationStopGroup",&PythonModuleClient::sendStimulationStopGroup)
        .def("sendGlobalStimulationSettings", &PythonModuleClient::sendGlobalStimulationSettings)
        .def("sendGlobalStimulationCommand", &PythonModuleClient::sendGlobalStimulationCommand)
        .def("sendStateScriptShortcutMessage", &PythonModuleClient::sendStateScriptShortcutMessage)
        .def("latestTrodesTimestamp", &PythonModuleClient::latestTrodesTimestamp)
        .def("sendAnnotationRequest", &PythonModuleClient::sendAnnotationRequest)
        ;
}